

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::ArenaTest_UnsafeArenaSetAllocatedAcrossArenasWithReflection_Test::TestBody
          (ArenaTest_UnsafeArenaSetAllocatedAcrossArenasWithReflection_Test *this)

{
  Message *message;
  FieldDescriptor *field;
  TestAllTypes *this_00;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Arena *pAVar2;
  char *pcVar3;
  Metadata MVar4;
  Metadata MVar5;
  string_view name;
  NestedMessage *arena2_submessage;
  NestedMessage *arena1_submessage;
  Arena arena2;
  Arena arena1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_190;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_188;
  TestAllTypes_NestedMessage *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  AssertHelper local_170;
  undefined1 local_168 [8];
  TaggedAllocationPolicyPtr local_160;
  ThreadSafeArena local_c0;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_c0);
  message = (Message *)Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_c0);
  MVar4 = proto2_unittest::TestAllTypes::GetMetadata
                    ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
  MVar5 = proto2_unittest::TestAllTypes::GetMetadata
                    ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
  name._M_str = "optional_nested_message";
  name._M_len = 0x17;
  field = Descriptor::FindFieldByName(MVar5.descriptor,name);
  protobuf::internal::ThreadSafeArena::ThreadSafeArena((ThreadSafeArena *)local_168);
  local_188._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>((Arena *)local_168);
  *(undefined4 *)&local_188._M_head_impl[0x18].field_0x0 = 0x2a;
  local_188._M_head_impl[0x10] =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
       ((byte)local_188._M_head_impl[0x10] | 1);
  Reflection::UnsafeArenaSetAllocatedMessage
            (MVar4.reflection,message,(Message *)local_188._M_head_impl,field);
  *(byte *)&message[1].super_MessageLite._vptr_MessageLite =
       *(byte *)&message[1].super_MessageLite._vptr_MessageLite | 0x20;
  local_190._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       message[0x22].super_MessageLite._vptr_MessageLite;
  if (local_190._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pAVar2 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pAVar2 & 1) != 0) {
      pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
    }
    local_190._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>(pAVar2);
    message[0x22].super_MessageLite._vptr_MessageLite = (_func_int **)local_190._M_head_impl;
  }
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypes_NestedMessage*,proto2_unittest::TestAllTypes_NestedMessage*>
            ((internal *)&local_180,"arena2_submessage",
             "arena1_message->mutable_optional_nested_message()",
             (TestAllTypes_NestedMessage **)&local_188,(TestAllTypes_NestedMessage **)&local_190);
  if (local_180._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar3 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x404,pcVar3);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(_func_int **)local_190._M_head_impl + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  *(byte *)&message[1].super_MessageLite._vptr_MessageLite =
       *(byte *)&message[1].super_MessageLite._vptr_MessageLite & 0xdf;
  local_190._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       message[0x22].super_MessageLite._vptr_MessageLite;
  message[0x22].super_MessageLite._vptr_MessageLite = (_func_int **)0x0;
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypes_NestedMessage*,proto2_unittest::TestAllTypes_NestedMessage*>
            ((internal *)&local_180,"arena2_submessage",
             "arena1_message->unsafe_arena_release_optional_nested_message()",
             (TestAllTypes_NestedMessage **)&local_188,(TestAllTypes_NestedMessage **)&local_190);
  if (local_180._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar3 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x406,pcVar3);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(_func_int **)local_190._M_head_impl + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena((ThreadSafeArena *)local_168);
  local_180 = (TestAllTypes_NestedMessage *)
              Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>
                        ((Arena *)&local_c0);
  *(undefined4 *)((long)&local_180->field_0 + 8) = 0x2a;
  *(byte *)&local_180->field_0 = *(byte *)&local_180->field_0 | 1;
  this_00 = (TestAllTypes *)operator_new(0x340);
  proto2_unittest::TestAllTypes::TestAllTypes(this_00,(Arena *)0x0);
  Reflection::UnsafeArenaSetAllocatedMessage
            (MVar4.reflection,(Message *)this_00,&local_180->super_Message,field);
  *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 0x20;
  pbVar1 = *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((long)&this_00->field_0 + 0x210);
  if (pbVar1 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pAVar2 = (Arena *)(this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar2 & 1) != 0) {
      pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
    }
    pbVar1 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>(pAVar2);
    *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
     ((long)&this_00->field_0 + 0x210) = pbVar1;
  }
  local_188._M_head_impl = pbVar1;
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypes_NestedMessage*,proto2_unittest::TestAllTypes_NestedMessage*>
            ((internal *)local_168,"arena1_submessage",
             "heap_message->mutable_optional_nested_message()",&local_180,
             (TestAllTypes_NestedMessage **)&local_188);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160.policy_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar3 = *(char **)local_160.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x40e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160.policy_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_160.policy_);
  }
  *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 & 0xdf;
  local_188._M_head_impl =
       *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
        ((long)&this_00->field_0 + 0x210);
  (this_00->field_0)._impl_.optional_nested_message_ = (TestAllTypes_NestedMessage *)0x0;
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypes_NestedMessage*,proto2_unittest::TestAllTypes_NestedMessage*>
            ((internal *)local_168,"arena1_submessage",
             "heap_message->unsafe_arena_release_optional_nested_message()",&local_180,
             (TestAllTypes_NestedMessage **)&local_188);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160.policy_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar3 = *(char **)local_160.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x410,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160.policy_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_160.policy_);
  }
  proto2_unittest::TestAllTypes::~TestAllTypes(this_00);
  operator_delete(this_00,0x340);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_c0);
  return;
}

Assistant:

TEST(ArenaTest, UnsafeArenaSetAllocatedAcrossArenasWithReflection) {
  // Same as above, with reflection.
  Arena arena1;
  TestAllTypes* arena1_message = Arena::Create<TestAllTypes>(&arena1);
  const Reflection* r = arena1_message->GetReflection();
  const Descriptor* d = arena1_message->GetDescriptor();
  const FieldDescriptor* msg_field =
      d->FindFieldByName("optional_nested_message");
  {
    Arena arena2;
    TestAllTypes::NestedMessage* arena2_submessage =
        Arena::Create<TestAllTypes::NestedMessage>(&arena2);
    arena2_submessage->set_bb(42);
    r->UnsafeArenaSetAllocatedMessage(arena1_message, arena2_submessage,
                                      msg_field);
    EXPECT_EQ(arena2_submessage,
              arena1_message->mutable_optional_nested_message());
    EXPECT_EQ(arena2_submessage,
              arena1_message->unsafe_arena_release_optional_nested_message());
  }

  TestAllTypes::NestedMessage* arena1_submessage =
      Arena::Create<TestAllTypes::NestedMessage>(&arena1);
  arena1_submessage->set_bb(42);
  TestAllTypes* heap_message = new TestAllTypes;
  r->UnsafeArenaSetAllocatedMessage(heap_message, arena1_submessage, msg_field);
  EXPECT_EQ(arena1_submessage, heap_message->mutable_optional_nested_message());
  EXPECT_EQ(arena1_submessage,
            heap_message->unsafe_arena_release_optional_nested_message());
  delete heap_message;
}